

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetPSKc
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aPSKc)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  format_args args;
  ErrorCode local_23c;
  Error local_238;
  anon_class_1_0_00000001 local_20a;
  v10 local_209;
  v10 *local_208;
  size_t local_200;
  string local_1f8;
  Error local_1d8;
  undefined1 local_1a0 [8];
  ActiveOperationalDataset activeDataset;
  ByteArray *aPSKc_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  activeDataset._215_1_ = 0;
  Error::Error(__return_storage_ptr__);
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_1a0);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    SetPSKc::anon_class_1_0_00000001::operator()(&local_20a);
    local_58 = &local_208;
    local_60 = &local_209;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_200 = bVar4.size_;
    local_208 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_1f8;
    local_78 = local_208;
    sStack_70 = local_200;
    local_50 = &local_78;
    local_88 = local_208;
    local_80 = local_200;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_1f8,local_88,fmt,args);
    Error::Error(&local_1d8,kInvalidState,&local_1f8);
    Error::operator=(__return_storage_ptr__,&local_1d8);
    Error::~Error(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &activeDataset.mNetworkMasterKey.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,aPSKc);
    activeDataset.mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ =
         (ushort)activeDataset.mSecurityPolicy.mFlags.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage | 0x80;
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar3->_vptr_Commissioner[0x1e])(&local_238,peVar3,local_1a0);
    aError = Error::operator=(__return_storage_ptr__,&local_238);
    local_23c = kNone;
    bVar1 = commissioner::operator!=(aError,&local_23c);
    Error::~Error(&local_238);
    if (!bVar1) {
      MergeDataset(&this->mActiveDataset,(ActiveOperationalDataset *)local_1a0);
    }
  }
  activeDataset._215_1_ = 1;
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_1a0);
  if ((activeDataset._215_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPSKc(const ByteArray &aPSKc)
{
    Error                    error;
    ActiveOperationalDataset activeDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    activeDataset.mPSKc = aPSKc;
    activeDataset.mPresentFlags |= ActiveOperationalDataset::kPSKcBit;

    SuccessOrExit(error = mCommissioner->SetActiveDataset(activeDataset));

    MergeDataset(mActiveDataset, activeDataset);

exit:
    return error;
}